

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O3

void __thiscall cppnet::Address::Address(Address *this,Address *addr)

{
  pointer pcVar1;
  
  this->_address_type = addr->_address_type;
  (this->_ip)._M_dataplus._M_p = (pointer)&(this->_ip).field_2;
  pcVar1 = (addr->_ip)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_ip,pcVar1,pcVar1 + (addr->_ip)._M_string_length);
  this->_port = addr->_port;
  return;
}

Assistant:

Address::Address(const Address& addr):
    _address_type(addr._address_type),
    _ip(addr._ip),
    _port(addr._port) {

}